

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O3

bool __thiscall
features::Sift::descriptor_assignment(Sift *this,Keypoint *kp,Descriptor *desc,Octave *octave)

{
  Vector<float,_128> *__s;
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  long lVar3;
  int i;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  int iVar10;
  float *pfVar11;
  ulong uVar12;
  undefined1 uVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  float *pfVar17;
  bool bVar18;
  long lVar19;
  uint *puVar20;
  uint uVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float local_b8;
  float local_b4;
  float weights [3] [2];
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  int local_84;
  int local_80;
  float local_7c;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  uint local_54;
  uint local_50;
  float local_4c;
  element_type *local_48;
  float local_40;
  float local_3c;
  undefined1 local_35;
  float local_34;
  
  local_40 = kp->sample;
  local_34 = kp->x;
  local_60 = CONCAT44(local_60._4_4_,kp->y);
  if (local_40 <= 0.0) {
    fVar23 = ceilf(local_40 + -0.5);
  }
  else {
    fVar23 = floorf(local_40 + 0.5);
  }
  local_78 = CONCAT44(local_78._4_4_,local_34 + 0.5);
  local_48 = (element_type *)CONCAT44(local_48._4_4_,(float)local_60 + 0.5);
  local_3c = (this->options).base_blur_sigma;
  fVar24 = exp2f((local_40 + 1.0) / (float)(this->options).num_samples_per_octave);
  lVar7 = (long)(int)fVar23 + 1;
  psVar1 = (octave->grad).
           super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar2 = psVar1[lVar7].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = psVar1[lVar7].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_70 = (ulong)(uint)(int)(float)local_78;
  local_68 = (ulong)(uint)(int)local_48._0_4_;
  local_3c = local_3c * fVar24;
  psVar1 = (octave->ori).
           super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_48 = psVar1[lVar7].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  this_01 = psVar1[lVar7].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  iVar5 = *(int *)((long)&peVar2->super_TypedImageBase<float> + 8);
  iVar6 = *(int *)((long)&peVar2->super_TypedImageBase<float> + 0xc);
  __s = &desc->data;
  memset(__s,0,0x200);
  fVar23 = sinf(desc->orientation);
  local_4c = cosf(desc->orientation);
  local_3c = local_3c * 3.0;
  uVar16 = (uint)(local_3c * 1.4142135 * 5.0 * 0.5);
  iVar10 = (int)local_70;
  bVar22 = (int)(iVar10 + uVar16) < iVar5;
  iVar15 = (int)local_68;
  bVar14 = (int)(uVar16 + iVar15) < iVar6;
  uVar13 = bVar14 && (((int)uVar16 <= iVar15 && (int)uVar16 <= iVar10) && bVar22);
  local_80 = iVar5;
  if (bVar14 && (((int)uVar16 <= iVar15 && (int)uVar16 <= iVar10) && bVar22)) {
    local_35 = uVar13;
    if (-1 < (int)uVar16) {
      local_88 = (float)iVar10 - local_34;
      local_7c = (float)iVar15 - (float)local_60;
      local_84 = uVar16 + 1;
      lVar7 = *(long *)&((ImageData *)((long)&peVar2->super_TypedImageBase<float> + 0x18))->
                        super__Vector_base<float,_std::allocator<float>_>;
      lVar3 = *(long *)&((ImageData *)((long)&local_48->super_TypedImageBase<float> + 0x18))->
                        super__Vector_base<float,_std::allocator<float>_>;
      uVar4 = -uVar16;
      do {
        iVar5 = ((int)local_68 + uVar4) * local_80 + (int)local_70;
        fVar24 = (float)(int)uVar4 + local_7c;
        local_8c = fVar24 * local_4c;
        uVar12 = (ulong)-uVar16;
        do {
          lVar8 = (long)(iVar5 + (int)uVar12);
          fVar25 = *(float *)(lVar3 + lVar8 * 4) - desc->orientation;
          fVar26 = (float)(int)uVar12 + local_88;
          local_40 = (local_4c * fVar26 + fVar23 * fVar24) / local_3c + 1.5;
          local_34 = (fVar26 * -fVar23 + local_8c) / local_3c + 1.5;
          local_94 = *(float *)(lVar7 + lVar8 * 4);
          local_48 = (element_type *)
                     CONCAT44(local_48._4_4_,
                              ((float)(-(uint)(fVar25 < 0.0) & (uint)(fVar25 + 6.2831855) |
                                      ~-(uint)(fVar25 < 0.0) & (uint)fVar25) * 8.0) / 6.2831855 +
                              -0.5);
          local_78 = uVar12;
          local_90 = expf(((local_40 + -1.5) * (local_40 + -1.5) +
                          (local_34 + -1.5) * (local_34 + -1.5)) * -0.125);
          fVar25 = floorf(local_40);
          local_60 = (ulong)(uint)(int)fVar25;
          uVar21 = (int)fVar25 + 1;
          fVar25 = floorf(local_34);
          weights[2][1] = (float)(int)fVar25;
          fVar25 = (float)((int)weights[2][1] + 1);
          local_98 = fVar25;
          fVar26 = floorf(local_48._0_4_);
          local_54 = (uint)fVar26;
          uVar12 = (ulong)local_54;
          local_50 = local_54 + 1;
          fVar26 = (float)(int)uVar21;
          local_b8 = fVar26 - local_40;
          local_b4 = (local_40 - fVar26) + 1.0;
          fVar25 = (float)(int)fVar25;
          weights[0][0] = fVar25 - local_34;
          weights[0][1] = (local_34 - fVar25) + 1.0;
          weights[1][0] = (float)(int)local_50 - local_48._0_4_;
          weights[1][1] = (local_48._0_4_ - (float)(int)local_50) + 1.0;
          if ((int)local_54 < 0) {
            uVar12 = (ulong)(local_54 + 8);
            local_54 = local_54 + 8;
          }
          else if (7 < local_50) {
            uVar12 = (ulong)(local_54 - 7);
            local_50 = local_54 - 7;
          }
          uVar9 = CONCAT71((int7)(uVar12 >> 8),1);
          pfVar11 = weights[2] + 1;
          lVar8 = 0;
          do {
            fVar25 = (float)uVar9;
            pfVar17 = &local_b8;
            uVar12 = local_60;
            bVar22 = true;
            do {
              bVar14 = bVar22;
              lVar19 = 0;
              puVar20 = &local_54;
              bVar22 = true;
              do {
                bVar18 = bVar22;
                if (((uint)uVar12 < 4) && ((uint)*pfVar11 < 4)) {
                  iVar6 = ((int)*pfVar11 << 5 | (uint)uVar12 * 8) + *puVar20;
                  __s->v[iVar6] =
                       *pfVar17 * local_94 * local_90 * weights[0][lVar8] * weights[1][lVar19] +
                       __s->v[iVar6];
                }
                lVar19 = 1;
                puVar20 = &local_50;
                bVar22 = false;
              } while (bVar18);
              pfVar17 = &local_b4;
              uVar12 = (ulong)uVar21;
              bVar22 = false;
            } while (bVar14);
            lVar8 = 1;
            pfVar11 = &local_98;
            local_34._0_1_ = (char)uVar9;
            uVar9 = 0;
          } while (local_34._0_1_ != '\0');
          uVar12 = local_78 + 1;
        } while (local_84 != (int)uVar12);
        bVar22 = uVar4 != uVar16;
        uVar4 = uVar4 + 1;
        local_34 = fVar25;
      } while (bVar22);
    }
    fVar23 = 0.0;
    lVar7 = 0;
    do {
      fVar24 = *(float *)((long)__s->v + lVar7);
      fVar23 = fVar23 + fVar24 * fVar24;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x200);
    if (fVar23 < 0.0) {
      fVar23 = sqrtf(fVar23);
    }
    else {
      fVar23 = SQRT(fVar23);
    }
    uVar13 = local_35;
    lVar7 = 0;
    do {
      *(float *)((long)__s->v + lVar7) = *(float *)((long)__s->v + lVar7) / fVar23;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x200);
    lVar7 = 0;
    do {
      fVar23 = 0.2;
      if (__s->v[lVar7] <= 0.2) {
        fVar23 = __s->v[lVar7];
      }
      __s->v[lVar7] = fVar23;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x80);
    fVar23 = 0.0;
    lVar7 = 0;
    do {
      fVar24 = *(float *)((long)__s->v + lVar7);
      fVar23 = fVar23 + fVar24 * fVar24;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x200);
    if (fVar23 < 0.0) {
      fVar23 = sqrtf(fVar23);
    }
    else {
      fVar23 = SQRT(fVar23);
    }
    lVar7 = 0;
    do {
      *(float *)((long)__s->v + lVar7) = *(float *)((long)__s->v + lVar7) / fVar23;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x200);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return (bool)uVar13;
}

Assistant:

bool
Sift::descriptor_assignment (Keypoint const& kp, Descriptor& desc,
    Octave const* octave)
{
    /*
     * The final feature vector has size PXB * PXB * OHB.
     * The following constants should not be changed yet, as the
     * (PXB^2 * OHB = 128) element feature vector is still hard-coded.
     */
    //int const PIX = 16; // Descriptor region with 16x16 pixel
    int const PXB = 4; // Pixel bins with 4x4 bins
    int const OHB = 8; // Orientation histogram with 8 bins

    /* Integral x and y coordinates and closest scale sample. */
    int const ix = static_cast<int>(kp.x + 0.5f);
    int const iy = static_cast<int>(kp.y + 0.5f);
    int const is = static_cast<int>(math::round(kp.sample));
    float const dxf = kp.x - static_cast<float>(ix);
    float const dyf = kp.y - static_cast<float>(iy);
    float const sigma = this->keypoint_relative_scale(kp);

    /* Images with its dimension for the keypoint. */
    core::FloatImage::ConstPtr grad(octave->grad[is + 1]);
    core::FloatImage::ConstPtr ori(octave->ori[is + 1]);
    int const width = grad->width();
    int const height = grad->height();

    /* Clear feature vector. */
    desc.data.fill(0.0f);

    /* Rotation constants given by descriptor orientation. */
    float const sino = std::sin(desc.orientation);
    float const coso = std::cos(desc.orientation);

    /*
     * Compute window size.
     * Each spacial bin has an extension of 3 * sigma (sigma is the scale
     * of the keypoint). For interpolation we need another half bin at
     * both ends in each dimension. And since the window can be arbitrarily
     * rotated, we need to multiply with sqrt(2). The window size is:
     * 2W = sqrt(2) * 3 * sigma * (PXB + 1).
     */
    float const binsize = 3.0f * sigma;
    int win = MATH_SQRT2 * binsize * (float)(PXB + 1) * 0.5f;
    if (ix < win || ix + win >= width || iy < win || iy + win >= height)
        return false;

    /*
     * Iterate over the window, intersected with the image region
     * from (1,1) to (w-2, h-2) since gradients/orientations are
     * not defined at the boundary pixels. Add all samples to the
     * corresponding bin.
     */
    int const center = iy * width + ix; // Center pixel at KP location
    for (int dy = -win; dy <= win; ++dy)
    {
        int const yoff = dy * width;
        for (int dx = -win; dx <= win; ++dx)
        {
            /* Get pixel gradient magnitude and orientation. */
            float const mod = grad->at(center + yoff + dx);
            float const angle = ori->at(center + yoff + dx);
            float theta = angle - desc.orientation;
            if (theta < 0.0f)
                theta += 2.0f * MATH_PI;

            /* Compute fractional coordinates w.r.t. the window. */
            float const winx = (float)dx - dxf;
            float const winy = (float)dy - dyf;

            /*
             * Compute normalized coordinates w.r.t. bins. The window
             * coordinates are rotated around the keypoint. The bins are
             * chosen such that 0 is the coordinate of the first bins center
             * in each dimension. In other words, (0,0,0) is the coordinate
             * of the first bin center in the three dimensional histogram.
             */
            float binoff = (float)(PXB - 1) / 2.0f;
            float binx = (coso * winx + sino * winy) / binsize + binoff;
            float biny = (-sino * winx + coso * winy) / binsize + binoff;
            float bint = theta * (float)OHB / (2.0f * MATH_PI) - 0.5f;

            /* Compute circular window weight for the sample. */
            float gaussian_sigma = 0.5f * (float)PXB;
            float gaussian_weight = math::gaussian_xx
                (MATH_POW2(binx - binoff) + MATH_POW2(biny - binoff),
                gaussian_sigma);

            /* Total contribution of the sample in the histogram is now: */
            float contrib = mod * gaussian_weight;

            /*
             * Distribute values into bins (using trilinear interpolation).
             * Each sample is inserted into 8 bins. Some of these bins may
             * not exist, because the sample is outside the keypoint window.
             */
            int bxi[2] = { (int)std::floor(binx), (int)std::floor(binx) + 1 };
            int byi[2] = { (int)std::floor(biny), (int)std::floor(biny) + 1 };
            int bti[2] = { (int)std::floor(bint), (int)std::floor(bint) + 1 };

            float weights[3][2] = {
                { (float)bxi[1] - binx, 1.0f - ((float)bxi[1] - binx) },
                { (float)byi[1] - biny, 1.0f - ((float)byi[1] - biny) },
                { (float)bti[1] - bint, 1.0f - ((float)bti[1] - bint) }
            };

            // Wrap around orientation histogram
            if (bti[0] < 0)
                bti[0] += OHB;
            if (bti[1] >= OHB)
                bti[1] -= OHB;

            /* Iterate the 8 bins and add weighted contrib to each. */
            int const xstride = OHB;
            int const ystride = OHB * PXB;
            for (int y = 0; y < 2; ++y)
                for (int x = 0; x < 2; ++x)
                    for (int t = 0; t < 2; ++t)
                    {
                        if (bxi[x] < 0 || bxi[x] >= PXB
                            || byi[y] < 0 || byi[y] >= PXB)
                            continue;

                        int idx = bti[t] + bxi[x] * xstride + byi[y] * ystride;
                        desc.data[idx] += contrib * weights[0][x]
                            * weights[1][y] * weights[2][t];
                    }
        }
    }

    /* Normalize the feature vector. */
    desc.data.normalize();

    /* Truncate descriptor values to 0.2. */
    for (int i = 0; i < PXB * PXB * OHB; ++i)
        desc.data[i] = std::min(desc.data[i], 0.2f);

    /* Normalize once again. */
    desc.data.normalize();

    return true;
}